

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int bbSPIXfer(uint CS,char *inBuf,char *outBuf,uint count)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  char cVar6;
  long lVar7;
  byte bVar8;
  
  __stream = _stderr;
  uVar3 = (ulong)CS;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(count,inBuf);
    fprintf(__stream,"%s %s: CS=%d inBuf=%s outBuf=%08X count=%d\n",myTimeStamp::buf,"bbSPIXfer",
            uVar3,myBuf2Str::str,outBuf,(ulong)count);
  }
  if (libInitialised == '\0') {
    count = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      bbSPIXfer_cold_1();
    }
  }
  else if (CS < 0x20) {
    if (wfRx[uVar3].mode == 7) {
      if (inBuf == (char *)0x0 || count == 0) {
        count = 0xffffffa6;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          bbSPIXfer_cold_3();
        }
      }
      else if (outBuf == (char *)0x0) {
        count = 0xffffffa6;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          bbSPIXfer_cold_4();
        }
      }
      else {
        iVar1 = wfRx[uVar3].field_4.s.readPos;
        wfRx[iVar1].field_4.I.SDA = CS;
        wfRx[iVar1].baud = wfRx[uVar3].baud;
        *(undefined8 *)((long)&wfRx[iVar1].field_4 + 0x14) =
             *(undefined8 *)((long)&wfRx[uVar3].field_4 + 0x14);
        pthread_mutex_lock((pthread_mutex_t *)&wfRx[iVar1].mutex);
        uVar2 = wfRx[iVar1].field_4.s.readPos;
        lVar4 = 0x1c;
        if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 2) == 0) {
          lVar4 = 0x28;
        }
        *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) = 1 << ((byte)uVar2 & 0x1f);
        myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
        uVar2 = wfRx[iVar1].field_4.I.SDA;
        lVar4 = 0x1c;
        if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 4) == 0) {
          lVar4 = 0x28;
        }
        *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) = 1 << ((byte)uVar2 & 0x1f);
        myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
        uVar3 = 0;
        do {
          bVar8 = inBuf[uVar3];
          if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 1) == 0) {
            cVar6 = '\b';
            bVar5 = 0;
            do {
              uVar2 = wfRx[iVar1].field_4.s.bufSize;
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x19) & 0x40) == 0) {
                lVar4 = 0x1c;
                if (-1 < (char)bVar8) {
                  lVar4 = 0x28;
                }
                *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) =
                     1 << ((byte)uVar2 & 0x1f);
                bVar8 = bVar8 * '\x02';
              }
              else {
                lVar4 = 0x1c;
                if ((bVar8 & 1) == 0) {
                  lVar4 = 0x28;
                }
                *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) =
                     1 << ((byte)uVar2 & 0x1f);
                bVar8 = (char)bVar8 >> 1;
              }
              myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
              uVar2 = wfRx[iVar1].field_4.s.readPos;
              lVar4 = 0x28;
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 2) == 0) {
                lVar4 = 0x1c;
              }
              *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) = 1 << ((byte)uVar2 & 0x1f);
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x19) & 0x80) == 0) {
                uVar2 = wfRx[iVar1].field_4.I.SCL;
                bVar5 = ((gpioReg[(ulong)(uVar2 >> 5) + 0xd] >> (uVar2 & 0x1f) & 1) != 0) +
                        bVar5 * '\x02';
              }
              else {
                uVar2 = wfRx[iVar1].field_4.I.SCL;
                bVar5 = bVar5 >> 1 |
                        (char)(gpioReg[(ulong)(uVar2 >> 5) + 0xd] >> ((byte)uVar2 & 0x1f)) << 7;
              }
              myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
              uVar2 = wfRx[iVar1].field_4.s.readPos;
              lVar4 = 0x1c;
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 2) == 0) {
                lVar4 = 0x28;
              }
              *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) = 1 << ((byte)uVar2 & 0x1f);
              cVar6 = cVar6 + -1;
            } while (cVar6 != '\0');
          }
          else {
            cVar6 = '\b';
            bVar5 = 0;
            do {
              uVar2 = wfRx[iVar1].field_4.s.readPos;
              lVar4 = 0x28;
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 2) == 0) {
                lVar4 = 0x1c;
              }
              *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) = 1 << ((byte)uVar2 & 0x1f);
              uVar2 = wfRx[iVar1].field_4.s.bufSize;
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x19) & 0x40) == 0) {
                lVar4 = 0x1c;
                if (-1 < (char)bVar8) {
                  lVar4 = 0x28;
                }
                *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) =
                     1 << ((byte)uVar2 & 0x1f);
                bVar8 = bVar8 * '\x02';
              }
              else {
                lVar4 = 0x1c;
                if ((bVar8 & 1) == 0) {
                  lVar4 = 0x28;
                }
                *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) =
                     1 << ((byte)uVar2 & 0x1f);
                bVar8 = (char)bVar8 >> 1;
              }
              myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
              uVar2 = wfRx[iVar1].field_4.s.readPos;
              lVar4 = 0x1c;
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 2) == 0) {
                lVar4 = 0x28;
              }
              *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) = 1 << ((byte)uVar2 & 0x1f);
              if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x19) & 0x80) == 0) {
                uVar2 = wfRx[iVar1].field_4.I.SCL;
                bVar5 = ((gpioReg[(ulong)(uVar2 >> 5) + 0xd] >> (uVar2 & 0x1f) & 1) != 0) +
                        bVar5 * '\x02';
              }
              else {
                uVar2 = wfRx[iVar1].field_4.I.SCL;
                bVar5 = bVar5 >> 1 |
                        (char)(gpioReg[(ulong)(uVar2 >> 5) + 0xd] >> ((byte)uVar2 & 0x1f)) << 7;
              }
              myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
              cVar6 = cVar6 + -1;
            } while (cVar6 != '\0');
          }
          outBuf[uVar3] = bVar5;
          uVar3 = uVar3 + 1;
        } while (uVar3 != count + (count == 0));
        myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
        uVar2 = wfRx[iVar1].field_4.I.SDA;
        lVar7 = 0x1c;
        lVar4 = 0x28;
        if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 4) == 0) {
          lVar4 = 0x1c;
        }
        *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar4) = 1 << ((byte)uVar2 & 0x1f);
        myGpioDelay(wfRx[iVar1].field_4.s.fullBit);
        uVar2 = wfRx[iVar1].field_4.s.readPos;
        if ((*(byte *)((long)&wfRx[iVar1].field_4 + 0x18) & 2) == 0) {
          lVar7 = 0x28;
        }
        *(int *)((long)gpioReg + (ulong)(uVar2 >> 5) * 4 + lVar7) = 1 << ((byte)uVar2 & 0x1f);
        pthread_mutex_unlock((pthread_mutex_t *)&wfRx[iVar1].mutex);
      }
    }
    else {
      count = 0xffffff72;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        bbSPIXfer_cold_2();
      }
    }
  }
  else {
    count = 0xfffffffe;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      bbSPIXfer_cold_5();
    }
  }
  return count;
}

Assistant:

int bbSPIXfer(
   unsigned CS,
   char *inBuf,
   char *outBuf,
   unsigned count)
{
   int SCLK;
   int pos;
   wfRx_t *w;

   DBG(DBG_USER, "CS=%d inBuf=%s outBuf=%08X count=%d",
      CS, myBuf2Str(count, (char *)inBuf), (int)outBuf, count);

   CHECK_INITED;

   if (CS > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", CS);

   if (wfRx[CS].mode != PI_WFRX_SPI_CS)
      SOFT_ERROR(PI_NOT_SPI_GPIO, "no SPI on gpio (%d)", CS);

   if (!inBuf || !count)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && count)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   SCLK = wfRx[CS].S.SCLK;

   wfRx[SCLK].S.CS = CS;
   wfRx[SCLK].baud = wfRx[CS].baud;
   wfRx[SCLK].S.delay = wfRx[CS].S.delay;
   wfRx[SCLK].S.spiFlags = wfRx[CS].S.spiFlags;

   w = &wfRx[SCLK];

   wfRx_lock(SCLK);

   bbSPIStart(w);
     
   for (pos=0; pos < count; pos++)
   {
      outBuf[pos] = bbSPIXferByte(w, inBuf[pos]);
   }

   bbSPIStop(w);

   wfRx_unlock(SCLK);

   return count;
}